

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.c
# Opt level: O0

OPJ_BOOL opj_thread_pool_submit_job(opj_thread_pool_t *tp,opj_job_fn job_fn,void *user_data)

{
  opj_worker_thread_t *poVar1;
  opj_worker_thread_list_t *ptr;
  opj_worker_thread_job_t *ptr_00;
  opj_job_list_t *poVar2;
  opj_worker_thread_list_t *to_opj_free;
  opj_worker_thread_list_t *next;
  opj_worker_thread_t *worker_thread;
  opj_job_list_t *item;
  opj_worker_thread_job_t *job;
  void *user_data_local;
  opj_job_fn job_fn_local;
  opj_thread_pool_t *tp_local;
  
  if (tp->mutex == (opj_mutex_t *)0x0) {
    (*job_fn)(user_data,tp->tls);
    tp_local._4_4_ = 1;
  }
  else {
    ptr_00 = (opj_worker_thread_job_t *)opj_malloc(0x10);
    if (ptr_00 == (opj_worker_thread_job_t *)0x0) {
      tp_local._4_4_ = 0;
    }
    else {
      ptr_00->job_fn = job_fn;
      ptr_00->user_data = user_data;
      poVar2 = (opj_job_list_t *)opj_malloc(0x10);
      if (poVar2 == (opj_job_list_t *)0x0) {
        opj_free(ptr_00);
        tp_local._4_4_ = 0;
      }
      else {
        poVar2->job = ptr_00;
        opj_mutex_lock(tp->mutex);
        tp->signaling_threshold = tp->worker_threads_count * 100;
        while (tp->signaling_threshold < tp->pending_jobs_count) {
          opj_cond_wait(tp->cond,tp->mutex);
        }
        poVar2->next = tp->job_queue;
        tp->job_queue = poVar2;
        tp->pending_jobs_count = tp->pending_jobs_count + 1;
        if (tp->waiting_worker_thread_list == (opj_worker_thread_list_t *)0x0) {
          opj_mutex_unlock(tp->mutex);
        }
        else {
          poVar1 = tp->waiting_worker_thread_list->worker_thread;
          if (poVar1->marked_as_waiting == 0) {
            __assert_fail("worker_thread->marked_as_waiting",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/thread.c"
                          ,0x369,
                          "OPJ_BOOL opj_thread_pool_submit_job(opj_thread_pool_t *, opj_job_fn, void *)"
                         );
          }
          poVar1->marked_as_waiting = 0;
          ptr = tp->waiting_worker_thread_list;
          tp->waiting_worker_thread_list = tp->waiting_worker_thread_list->next;
          tp->waiting_worker_thread_count = tp->waiting_worker_thread_count + -1;
          opj_mutex_lock(poVar1->mutex);
          opj_mutex_unlock(tp->mutex);
          opj_cond_signal(poVar1->cond);
          opj_mutex_unlock(poVar1->mutex);
          opj_free(ptr);
        }
        tp_local._4_4_ = 1;
      }
    }
  }
  return tp_local._4_4_;
}

Assistant:

OPJ_BOOL opj_thread_pool_submit_job(opj_thread_pool_t* tp,
                                    opj_job_fn job_fn,
                                    void* user_data)
{
    opj_worker_thread_job_t* job;
    opj_job_list_t* item;

    if (tp->mutex == NULL) {
        job_fn(user_data, tp->tls);
        return OPJ_TRUE;
    }

    job = (opj_worker_thread_job_t*)opj_malloc(sizeof(opj_worker_thread_job_t));
    if (job == NULL) {
        return OPJ_FALSE;
    }
    job->job_fn = job_fn;
    job->user_data = user_data;

    item = (opj_job_list_t*) opj_malloc(sizeof(opj_job_list_t));
    if (item == NULL) {
        opj_free(job);
        return OPJ_FALSE;
    }
    item->job = job;

    opj_mutex_lock(tp->mutex);

    tp->signaling_threshold = 100 * tp->worker_threads_count;
    while (tp->pending_jobs_count > tp->signaling_threshold) {
        /* printf("%d jobs enqueued. Waiting\n", tp->pending_jobs_count); */
        opj_cond_wait(tp->cond, tp->mutex);
        /* printf("...%d jobs enqueued.\n", tp->pending_jobs_count); */
    }

    item->next = tp->job_queue;
    tp->job_queue = item;
    tp->pending_jobs_count ++;

    if (tp->waiting_worker_thread_list) {
        opj_worker_thread_t* worker_thread;
        opj_worker_thread_list_t* next;
        opj_worker_thread_list_t* to_opj_free;

        worker_thread = tp->waiting_worker_thread_list->worker_thread;

        assert(worker_thread->marked_as_waiting);
        worker_thread->marked_as_waiting = OPJ_FALSE;

        next = tp->waiting_worker_thread_list->next;
        to_opj_free = tp->waiting_worker_thread_list;
        tp->waiting_worker_thread_list = next;
        tp->waiting_worker_thread_count --;

        opj_mutex_lock(worker_thread->mutex);
        opj_mutex_unlock(tp->mutex);
        opj_cond_signal(worker_thread->cond);
        opj_mutex_unlock(worker_thread->mutex);

        opj_free(to_opj_free);
    } else {
        opj_mutex_unlock(tp->mutex);
    }

    return OPJ_TRUE;
}